

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CRotationY.hpp
# Opt level: O2

int __thiscall
qclab::qgates::CRotationY<std::complex<double>_>::toQASM
          (CRotationY<std::complex<double>_> *this,ostream *stream,int offset)

{
  int iVar1;
  int iVar2;
  int qubit;
  real_type angle;
  __string_type local_50;
  
  if ((this->super_QControlledGate2<std::complex<double>_>).controlState_ == 0) {
    qasmX_abi_cxx11_(&local_50,
                     (qclab *)(ulong)(uint)((this->super_QControlledGate2<std::complex<double>_>).
                                            control_ + offset),offset);
    std::operator<<(stream,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  iVar1 = (this->super_QControlledGate2<std::complex<double>_>).control_;
  iVar2 = (*(this->super_QControlledGate2<std::complex<double>_>).
            super_QGate2<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject
            [0xf])(this);
  angle = theta(this);
  qasmCRy<double>(&local_50,iVar1 + offset,iVar2 + offset,angle);
  std::operator<<(stream,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if ((this->super_QControlledGate2<std::complex<double>_>).controlState_ == 0) {
    qasmX_abi_cxx11_(&local_50,
                     (qclab *)(ulong)(uint)(offset + (this->
                                                  super_QControlledGate2<std::complex<double>_>).
                                                  control_),qubit);
    std::operator<<(stream,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return 0;
}

Assistant:

int toQASM( std::ostream& stream ,
                    const int offset = 0 ) const override {
          if ( this->controlState() == 0 ) {
            stream << qasmX( this->control() + offset ) ;
          }
          stream << qasmCRy( this->control() + offset ,
                             this->target()  + offset , theta() ) ;
          if ( this->controlState() == 0 ) {
            stream << qasmX( this->control() + offset ) ;
          }
          return 0 ;
        }